

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall
spirv_cross::CompilerMSL::add_component_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRVariable *var,
          SPIRType *type,InterfaceBlockMeta *meta)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t location;
  iterator iVar4;
  SPIREntryPoint *pSVar5;
  SPIRFunction *this_00;
  _func_void *p_Var6;
  SmallVector<std::function<void_()>,_0UL> *this_01;
  uint32_t local_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  SPIRType *local_78;
  SPIRVariable *pSStack_70;
  CompilerMSL *local_68;
  string local_60 [32];
  uint32_t local_40;
  uint32_t uStack_3c;
  uint32_t local_38;
  
  bVar2 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
  if (bVar2) {
    local_9c = Compiler::get_decoration
                         ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
    iVar4 = ::std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)meta,&local_9c);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::CompilerMSL::InterfaceBlockMeta::LocationMeta>,_false>
        ._M_cur != (__node_type *)0x0) {
      bVar2 = Compiler::has_decoration
                        ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation);
      if ((bVar2) && ((this->msl_options).pad_fragment_output_components == true)) {
        pSVar5 = Compiler::get_entry_point((Compiler *)this);
        bVar2 = storage == Output && pSVar5->model == ExecutionModelFragment;
      }
      else {
        bVar2 = false;
      }
      this_00 = Compiler::get<spirv_cross::SPIRFunction>
                          ((Compiler *)this,
                           (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
      uVar3 = Compiler::get_decoration((Compiler *)this,(ID)(var->super_IVariant).self.id,Component)
      ;
      uVar1 = type->vecsize;
      if (bVar2) {
        location = Compiler::get_decoration
                             ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationLocation)
        ;
        get_target_components_for_fragment_location(this,location);
      }
      SPIRFunction::add_local_variable(this_00,(VariableID)(var->super_IVariant).self.id);
      local_78 = (SPIRType *)CONCAT44(local_78._4_4_,(var->super_IVariant).self.id);
      SmallVector<unsigned_int,_8UL>::push_back
                (&this->vars_needing_early_declaration,(uint *)&local_78);
      local_78 = type;
      pSStack_70 = var;
      local_68 = this;
      uStack_3c = uVar1;
      local_38 = uVar3;
      if (var->storage == Input) {
        ::std::__cxx11::string::string(local_60,(string *)ib_var_ref);
        local_40 = local_9c;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        p_Var6 = (_func_void *)operator_new(0x48);
        *(CompilerMSL **)(p_Var6 + 0x10) = local_68;
        *(SPIRType **)p_Var6 = local_78;
        *(SPIRVariable **)(p_Var6 + 8) = pSStack_70;
        ::std::__cxx11::string::string((string *)(p_Var6 + 0x18),local_60);
        *(uint32_t *)(p_Var6 + 0x40) = local_38;
        *(ulong *)(p_Var6 + 0x38) = CONCAT44(uStack_3c,local_40);
        pcStack_80 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2632:40)>
                     ::_M_invoke;
        local_88 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2632:40)>
                   ::_M_manager;
        this_01 = &this_00->fixup_hooks_in;
        local_98._M_unused._0_8_ = (undefined8)p_Var6;
      }
      else {
        ::std::__cxx11::string::string(local_60,(string *)ib_var_ref);
        local_40 = local_9c;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        p_Var6 = (_func_void *)operator_new(0x48);
        *(CompilerMSL **)(p_Var6 + 0x10) = local_68;
        *(SPIRType **)p_Var6 = local_78;
        *(SPIRVariable **)(p_Var6 + 8) = pSStack_70;
        ::std::__cxx11::string::string((string *)(p_Var6 + 0x18),local_60);
        *(uint32_t *)(p_Var6 + 0x40) = local_38;
        *(ulong *)(p_Var6 + 0x38) = CONCAT44(uStack_3c,local_40);
        pcStack_80 = ::std::
                     _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2652:41)>
                     ::_M_invoke;
        local_88 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:2652:41)>
                   ::_M_manager;
        this_01 = &this_00->fixup_hooks_out;
        local_98._M_unused._0_8_ = (undefined8)p_Var6;
      }
      SmallVector<std::function<void_()>,_0UL>::push_back(this_01,(function<void_()> *)&local_98);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_98);
      ::std::__cxx11::string::~string(local_60);
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerMSL::add_component_variable_to_interface_block(spv::StorageClass storage, const std::string &ib_var_ref,
                                                            SPIRVariable &var,
                                                            const SPIRType &type,
                                                            InterfaceBlockMeta &meta)
{
	// Deal with Component decorations.
	const InterfaceBlockMeta::LocationMeta *location_meta = nullptr;
	uint32_t location = ~0u;
	if (has_decoration(var.self, DecorationLocation))
	{
		location = get_decoration(var.self, DecorationLocation);
		auto location_meta_itr = meta.location_meta.find(location);
		if (location_meta_itr != end(meta.location_meta))
			location_meta = &location_meta_itr->second;
	}

	// Check if we need to pad fragment output to match a certain number of components.
	if (location_meta)
	{
		bool pad_fragment_output = has_decoration(var.self, DecorationLocation) &&
		                           msl_options.pad_fragment_output_components &&
		                           get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput;

		auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
		uint32_t start_component = get_decoration(var.self, DecorationComponent);
		uint32_t type_components = type.vecsize;
		uint32_t num_components = location_meta->num_components;

		if (pad_fragment_output)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			num_components = max<uint32_t>(num_components, get_target_components_for_fragment_location(locn));
		}

		// We have already declared an IO block member as m_location_N.
		// Just emit an early-declared variable and fixup as needed.
		// Arrays need to be unrolled here since each location might need a different number of components.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		if (var.storage == StorageClassInput)
		{
			entry_func.fixup_hooks_in.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(to_name(var.self), "[", loc_off, "]", " = ", ib_var_ref,
						          ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), ";");
					}
				}
				else
				{
					statement(to_name(var.self), " = ", ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), ";");
				}
			});
		}
		else
		{
			entry_func.fixup_hooks_out.push_back([=, &type, &var]() {
				if (!type.array.empty())
				{
					uint32_t array_size = to_array_size_literal(type);
					for (uint32_t loc_off = 0; loc_off < array_size; loc_off++)
					{
						statement(ib_var_ref, ".m_location_", location + loc_off,
						          vector_swizzle(type_components, start_component), " = ",
						          to_name(var.self), "[", loc_off, "];");
					}
				}
				else
				{
					statement(ib_var_ref, ".m_location_", location,
					          vector_swizzle(type_components, start_component), " = ", to_name(var.self), ";");
				}
			});
		}
		return true;
	}
	else
		return false;
}